

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolDefinitionInlining.cpp
# Opt level: O1

void __thiscall
SymbolDefinitionInlining::collectBoundVariables(SymbolDefinitionInlining *this,Formula *formula)

{
  uint uVar1;
  uint *puVar2;
  VList *pVVar3;
  Formula *formula_00;
  VList *pVVar4;
  Term *t;
  undefined8 *puVar5;
  
LAB_007eaf6b:
  for (; formula->_connective - IMP < 3; formula = (Formula *)formula[1]._label._M_dataplus._M_p) {
    collectBoundVariables(this,*(Formula **)(formula + 1));
  }
  switch(formula->_connective) {
  case LITERAL:
    t = *(Term **)(formula + 1);
LAB_007eb013:
    collectBoundVariables(this,t);
    return;
  case AND:
  case OR:
    puVar5 = *(undefined8 **)(formula + 1);
    while (puVar5 != (undefined8 *)0x0) {
      formula_00 = (Formula *)*puVar5;
      puVar5 = (undefined8 *)puVar5[1];
      collectBoundVariables(this,formula_00);
    }
    break;
  default:
    break;
  case NOT:
    goto switchD_007eaf96_caseD_6;
  case FORALL:
  case EXISTS:
    collectBoundVariables(this,(Formula *)formula[1]._label._M_string_length);
    puVar2 = *(uint **)(formula + 1);
    while (puVar2 != (uint *)0x0) {
      uVar1 = *puVar2;
      puVar2 = *(uint **)(puVar2 + 2);
      pVVar3 = this->_bound;
      pVVar4 = (VList *)::Lib::FixedSizeAllocator<16UL>::alloc
                                  ((FixedSizeAllocator<16UL> *)
                                   (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      pVVar4->_head = uVar1;
      pVVar4->_tail = pVVar3;
      this->_bound = pVVar4;
    }
    break;
  case BOOL_TERM:
    t = *(Term **)(formula + 1);
    if (((ulong)t & 1) != 0) {
      return;
    }
    goto LAB_007eb013;
  }
  return;
switchD_007eaf96_caseD_6:
  formula = *(Formula **)(formula + 1);
  goto LAB_007eaf6b;
}

Assistant:

void SymbolDefinitionInlining::collectBoundVariables(Formula* formula) {
  switch (formula->connective()) {
    case FORALL:
    case EXISTS: {
      collectBoundVariables(formula->qarg());
      VList::Iterator vit(formula->vars());
      VList::pushFromIterator(vit, _bound);
      break;
    }

    case AND:
    case OR: {
      List<Formula*>::Iterator fit(formula->args());
      while (fit.hasNext()) {
        collectBoundVariables(fit.next());
      }
      break;
    }

    case NOT: {
      collectBoundVariables(formula->uarg());
      break;
    }

    case IMP:
    case IFF:
    case XOR: {
      collectBoundVariables(formula->left());
      collectBoundVariables(formula->right());
      break;
    }

    case BOOL_TERM: {
      collectBoundVariables(formula->getBooleanTerm());
      break;
    }

    case LITERAL: {
      collectBoundVariables(formula->literal());
      break;
    }

    default:
      break;
  }
}